

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O0

void __thiscall
enact::VariableStmt::VariableStmt
          (VariableStmt *this,Token *keyword,Token *name,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typeName,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *initializer)

{
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *initializer_local;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typeName_local;
  Token *name_local;
  Token *keyword_local;
  VariableStmt *this_local;
  
  Stmt::Stmt(&this->super_Stmt);
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__VariableStmt_0016a140;
  Token::Token(&this->keyword,keyword);
  Token::Token(&this->name,name);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
            (&this->typeName,typeName);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr
            (&this->initializer,initializer);
  return;
}

Assistant:

VariableStmt(
                Token keyword,
                Token name,
                std::unique_ptr<const Typename> typeName,
                std::unique_ptr<Expr> initializer) :
                keyword{std::move(keyword)},
                name{std::move(name)},
                typeName{std::move(typeName)},
                initializer{std::move(initializer)} {}